

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<unsigned_int,unsigned_int>::
     transfer<std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
               (allocator<std::pair<const_unsigned_int,_unsigned_int>_> *alloc,slot_type *new_slot,
               slot_type *old_slot)

{
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<std::pair<const_unsigned_int,_unsigned_int>_> *alloc_local;
  
  map_slot_policy<unsigned_int,_unsigned_int>::emplace(new_slot);
  allocator_traits<std::allocator<std::pair<unsigned_int_const,unsigned_int>>>::
  construct<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>>
            (alloc,(pair<unsigned_int,_unsigned_int> *)&new_slot->value,
             (pair<unsigned_int,_unsigned_int> *)&old_slot->value);
  destroy<std::allocator<std::pair<unsigned_int_const,unsigned_int>>>(alloc,old_slot);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
                         slot_type* old_slot) {
        emplace(new_slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                         std::move(old_slot->value));
        }
        destroy(alloc, old_slot);
    }